

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileNowdoc(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  sxu32 local_34;
  jx9_value *pjStack_30;
  sxu32 nIdx;
  jx9_value *pObj;
  SyString *pStr;
  jx9_gen_state *pjStack_18;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  pObj = (jx9_value *)pGen->pIn;
  local_34 = 0;
  pStr._4_4_ = iCompileFlag;
  pjStack_18 = pGen;
  if (pObj->iFlags == 0) {
    jx9VmEmitInstr(pGen->pVm,4,0,0,(void *)0x0,(sxu32 *)0x0);
    pGen_local._4_4_ = 0;
  }
  else {
    pjStack_30 = jx9VmReserveConstObj(pGen->pVm,&local_34);
    if (pjStack_30 == (jx9_value *)0x0) {
      jx9GenCompileError(pjStack_18,1,pjStack_18->pIn->nLine,"JX9 engine is running out of memory");
      pGen_local._4_4_ = -10;
    }
    else {
      jx9MemObjInitFromString(pjStack_18->pVm,pjStack_30,(SyString *)pObj);
      jx9VmEmitInstr(pjStack_18->pVm,4,0,local_34,(void *)0x0,(sxu32 *)0x0);
      pGen_local._4_4_ = 0;
    }
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 jx9CompileNowdoc(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyString *pStr = &pGen->pIn->sData; /* Constant string literal */
	jx9_value *pObj;
	sxu32 nIdx;
	nIdx = 0; /* Prevent compiler warning */
	if( pStr->nByte <= 0 ){
		/* Empty string, load NULL */
		jx9VmEmitInstr(pGen->pVm,JX9_OP_LOADC, 0, 0, 0, 0);
		return SXRET_OK;
	}
	/* Reserve a new constant */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "JX9 engine is running out of memory");
		SXUNUSED(iCompileFlag); /* cc warning */
		return SXERR_ABORT;
	}
	/* No processing is done here, simply a memcpy() operation */
	jx9MemObjInitFromString(pGen->pVm, pObj, pStr);
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}